

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::computeDualInfeasibilitiesWithFixedVariableFlips(HEkkDual *this)

{
  HEkk *pHVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pHVar1 = this->ekk_instance_;
  iVar3 = (pHVar1->lp_).num_row_;
  uVar2 = iVar3 + (pHVar1->lp_).num_col_;
  if (uVar2 == 0 || SCARRY4(iVar3,(pHVar1->lp_).num_col_) != (int)uVar2 < 0) {
    iVar3 = 0;
    dVar6 = 0.0;
    dVar5 = 0.0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    dVar5 = 0.0;
    dVar6 = 0.0;
    do {
      if ((pHVar1->basis_).nonbasicFlag_.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] != '\0') {
        dVar7 = (pHVar1->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar4];
        if ((-INFINITY <
             (pHVar1->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4]) ||
           ((pHVar1->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4] < INFINITY)) {
          dVar7 = dVar7 * (double)-(int)(pHVar1->basis_).nonbasicMove_.
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar4];
        }
        else {
          dVar7 = ABS(dVar7);
        }
        if (0.0 < dVar7) {
          iVar3 = (iVar3 + 1) -
                  (uint)(dVar7 < (pHVar1->options_->super_HighsOptionsStruct).
                                 dual_feasibility_tolerance);
          if (dVar6 <= dVar7) {
            dVar6 = dVar7;
          }
          dVar5 = dVar5 + dVar7;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  (pHVar1->info_).num_dual_infeasibilities = iVar3;
  (pHVar1->info_).max_dual_infeasibility = dVar6;
  (pHVar1->info_).sum_dual_infeasibilities = dVar5;
  return;
}

Assistant:

void HEkkDual::computeDualInfeasibilitiesWithFixedVariableFlips() {
  // Computes num/max/sum of dual infeasibilities, ignoring fixed
  // variables whose infeasibilities can be corrected by flipping at
  // the fixed value, so that decisions on the dual simplex phase can
  // be taken. It is driven by the use of nonbasicMove to identify
  // dual infeasibilities, using the bounds only to identify free
  // variables. Fixed variables are assumed to have nonbasicMove=0 so
  // that no dual infeasibility is counted for them. Indeed, when
  // called from cleanup() at the end of dual phase 1, nonbasicMove
  // relates to the phase 1 bounds, but workLower and workUpper will
  // have been set to phase 2 values! Note that there can be no free
  // variables in dual phase 1.
  HighsInt num_dual_infeasibility = 0;
  double max_dual_infeasibility = 0;
  double sum_dual_infeasibility = 0;
  HighsLp& lp = ekk_instance_.lp_;
  SimplexBasis& basis = ekk_instance_.basis_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsOptions* options = ekk_instance_.options_;
  const HighsInt num_tot = lp.num_col_ + lp.num_row_;
  // Possibly verify that nonbasicMove is correct for fixed variables
  // debugFixedNonbasicMove(ekk_instance_);
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    // Nonbasic column
    const double lower = info.workLower_[iVar];
    const double upper = info.workUpper_[iVar];
    const double dual = info.workDual_[iVar];
    double dual_infeasibility = 0;
    if (lower == -kHighsInf && upper == kHighsInf) {
      dual_infeasibility = fabs(dual);
    } else {
      dual_infeasibility = -basis.nonbasicMove_[iVar] * dual;
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= options->dual_feasibility_tolerance)
        num_dual_infeasibility++;
      max_dual_infeasibility =
          std::max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibility += dual_infeasibility;
    }
  }
  info.num_dual_infeasibilities = num_dual_infeasibility;
  info.max_dual_infeasibility = max_dual_infeasibility;
  info.sum_dual_infeasibilities = sum_dual_infeasibility;
}